

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

void __thiscall IR::Opnd::Dump(Opnd *this,IRDumpFlags flags,Func *func)

{
  Type TVar1;
  RegOpnd *this_00;
  code *pcVar2;
  bool bVar3;
  AddrOpndKind addressKind;
  int iVar4;
  uint uVar5;
  PropertyId propertyId;
  HelperCallOpnd *pHVar6;
  char16 *pcVar7;
  ListOpnd *pLVar8;
  SymOpnd *this_01;
  ValueType *pVVar9;
  RegBVOpnd *pRVar10;
  Float32ConstOpnd *pFVar11;
  FloatConstOpnd *pFVar12;
  IntConstOpnd *pIVar13;
  RegOpnd *pRVar14;
  ulong uVar15;
  LabelOpnd *pLVar16;
  IndirOpnd *this_02;
  PropertySymOpnd *this_03;
  ArrayRegOpnd *this_04;
  StackSym *pSVar17;
  undefined4 *puVar18;
  void *pvVar19;
  PropertySym *pPVar20;
  JITType *this_05;
  ObjTypeSpecFldInfo *this_06;
  PropertyRecord *pPVar21;
  BVSparse<Memory::JitArenaAllocator> *pBVar22;
  uint uVar23;
  ThreadContext *this_07;
  char16_t *pcVar24;
  char16_t *pcVar25;
  char16_t *pcVar26;
  int i;
  long lVar27;
  int iVar28;
  uint uVar29;
  char16_t *pcVar30;
  FloatConstType FVar31;
  JITTypeHolderBase<void> local_158;
  SparseBVUnit _unit;
  
  switch(this->m_kind) {
  case OpndKindIntConst:
    pIVar13 = AsIntConstOpnd(this);
    goto LAB_005aa7fa;
  case OpndKindInt64Const:
    pIVar13 = (IntConstOpnd *)AsInt64ConstOpnd(this);
LAB_005aa7fa:
    EncodableOpnd<long>::DumpEncodable(&pIVar13->super_EncodableOpnd<long>);
    break;
  case OpndKindFloatConst:
    pFVar12 = AsFloatConstOpnd(this);
    FVar31 = pFVar12->m_value;
    goto LAB_005aa7de;
  case OpndKindFloat32Const:
    pFVar11 = AsFloat32ConstOpnd(this);
    FVar31 = (FloatConstType)pFVar11->m_value;
LAB_005aa7de:
    Output::Print(L"%G",FVar31);
    break;
  case OpndKindHelperCall:
    pHVar6 = AsHelperCallOpnd(this);
    pcVar7 = GetMethodName(pHVar6->m_fnHelper);
    Output::Print(L"%s",pcVar7);
    break;
  case OpndKindSym:
    this_01 = AsSymOpnd(this);
    pVVar9 = &this_01->propertyOwnerValueType;
    if (this_01->m_sym->m_kind != SymKindProperty) {
      pVVar9 = &ValueType::Uninitialized;
    }
    if ((flags & IRDumpFlags_SimpleForm) != IRDumpFlags_None) {
      pVVar9 = &ValueType::Uninitialized;
    }
    Sym::Dump(this_01->m_sym,flags,(ValueType)pVVar9->field_0);
    if (this_01->m_sym->m_kind != SymKindStack) {
      bVar3 = SymOpnd::IsPropertySymOpnd(this_01);
      if (((flags & IRDumpFlags_SimpleForm) != IRDumpFlags_None) || (!bVar3)) break;
      this_03 = AsPropertySymOpnd(&this_01->super_Opnd);
      Output::Print(L"<");
      if (this_03->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
        Output::Print(L"?,,");
      }
      else {
        uVar5 = PropertySymOpnd::GetObjTypeSpecFldId(this_03);
        bVar3 = PropertySymOpnd::IsPoly(this_03);
        pcVar24 = L"m";
        if (bVar3) {
          pcVar24 = L"p";
        }
        bVar3 = PropertySymOpnd::IsLoadedFromProto(this_03);
        pcVar25 = L"~";
        if (!bVar3) {
          pcVar25 = L"";
        }
        pcVar30 = L"=";
        if (((ushort)this_03->field_12 & 2) == 0) {
          pcVar30 = L"";
        }
        bVar3 = PropertySymOpnd::IsBeingAdded(this_03);
        pcVar26 = L"+";
        if (!bVar3) {
          pcVar26 = L"";
        }
        Output::Print(L"%u,%s%s%s%s,",uVar5,pcVar24,pcVar25,pcVar30,pcVar26);
      }
      bVar3 = PropertySymOpnd::MayNeedTypeCheckProtection(this_03);
      if (bVar3) {
        bVar3 = PropertySymOpnd::IsMono(this_03);
        pcVar24 = L"Type not supported for unary +";
        pcVar25 = L"=";
      }
      else {
        bVar3 = PropertySymOpnd::IsRootObjectNonConfigurableFieldLoad(this_03);
        pcVar24 = L"Type not supported for unary ~";
        pcVar25 = L"-";
      }
      if (bVar3 != false) {
        pcVar25 = pcVar24 + 0x1d;
      }
      bVar3 = PropertySymOpnd::IsTypeCheckSeqCandidate(this_03);
      pcVar30 = L"+";
      pcVar24 = L"Type not supported for unary -";
      if (bVar3) {
        pcVar24 = L"Type not supported for unary +";
      }
      Output::Print(L"%s%s,",pcVar25,pcVar24 + 0x1d);
      bVar3 = PropertySymOpnd::HasObjectTypeSym(this_03);
      if (bVar3) {
        pSVar17 = PropertySymOpnd::GetObjectTypeSym(this_03);
        Output::Print(L"s%d",(ulong)(pSVar17->super_Sym).m_id);
        if (((this_03->field_12).objTypeSpecFlags & 0x800) == 0) {
          if (((this_03->field_12).objTypeSpecFlags & 0x200) != 0) {
            Output::Print(L"*");
          }
        }
        else {
          bVar3 = PropertySymOpnd::IsMono(this_03);
          pcVar24 = L"p";
          if (bVar3) {
            pcVar24 = L"m";
          }
          Output::Print(L"+%s",pcVar24);
        }
        if (((this_03->field_12).field_0.field_5.typeCheckSeqFlags & 4) != 0) {
          pcVar7 = L"!";
          goto LAB_005aae07;
        }
      }
      else {
        pcVar7 = L"s?";
LAB_005aae07:
        Output::Print(pcVar7);
      }
      pPVar20 = Sym::AsPropertySym((this_03->super_SymOpnd).m_sym);
      if (pPVar20->m_writeGuardSym == (PropertySym *)0x0) {
        pcVar30 = L",s?";
LAB_005aae4f:
        Output::Print(pcVar30);
      }
      else {
        pPVar20 = Sym::AsPropertySym((this_03->super_SymOpnd).m_sym);
        Output::Print(L",s%d",(ulong)(pPVar20->m_writeGuardSym->super_Sym).m_id);
        if (((this_03->field_12).field_0.field_5.typeCheckSeqFlags & 0x40) != 0) goto LAB_005aae4f;
      }
      bVar3 = PropertySymOpnd::HasFinalType(this_03);
      if (bVar3) {
        Output::Print(L",final:");
        local_158.t = (this_03->finalType).t;
        this_05 = JITTypeHolderBase<void>::operator->(&local_158);
        pvVar19 = (void *)JITType::GetAddr(this_05);
        DumpAddress(pvVar19,true,false);
      }
      if (this_03->guardedPropOps != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        Output::Print(L",{");
        if (func == (Func *)0x0) {
          Output::Print(L"(no func)");
        }
        else {
          pBVar22 = this_03->guardedPropOps;
          iVar28 = 0;
          while (pBVar22 = (BVSparse<Memory::JitArenaAllocator> *)pBVar22->head,
                pBVar22 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
            TVar1 = *(Type *)&pBVar22->lastFoundIndex;
            local_158.t = (Type)((Type *)&pBVar22->alloc)->word;
            while (local_158.t != (Type)0x0) {
              lVar27 = 0;
              if (local_158.t != (Type)0x0) {
                for (; ((ulong)local_158.t >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
                }
              }
              BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&local_158,(BVIndex)lVar27);
              if (0 < iVar28) {
                Output::Print(L",");
              }
              uVar23 = (BVIndex)lVar27 + TVar1;
              this_06 = Func::GetGlobalObjTypeSpecFldInfo(func->topFunc,uVar23);
              this_07 = (ThreadContext *)func->m_threadContextInfo[-3].wellKnownHostTypeIds;
              if (func->m_threadContextInfo == (ThreadContextInfo *)0x0) {
                this_07 = (ThreadContext *)0x0;
              }
              propertyId = ObjTypeSpecFldInfo::GetPropertyId(this_06);
              pPVar21 = ThreadContext::GetPropertyRecord(this_07,propertyId);
              Output::Print(L"%s",pPVar21 + 1,(ulong)uVar23);
              Output::Print(L"(%u)",(ulong)uVar23);
              bVar3 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_06);
              if (bVar3) {
                Output::Print(L"~");
              }
              bVar3 = ObjTypeSpecFldInfo::HasFixedValue(this_06);
              if (bVar3) {
                Output::Print(L"=");
              }
              bVar3 = ObjTypeSpecFldInfo::IsBeingAdded(this_06);
              if (bVar3) {
                Output::Print(L"+");
              }
              iVar28 = iVar28 + 1;
            }
          }
        }
        Output::Print(L"}");
      }
      if (this_03->writeGuards != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        Output::Print(L",{");
        pBVar22 = this_03->writeGuards;
        iVar28 = 0;
        while (pBVar22 = (BVSparse<Memory::JitArenaAllocator> *)pBVar22->head,
              pBVar22 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          TVar1 = *(Type *)&pBVar22->lastFoundIndex;
          local_158.t = (Type)((Type *)&pBVar22->alloc)->word;
          while (local_158.t != (Type)0x0) {
            lVar27 = 0;
            if (local_158.t != (Type)0x0) {
              for (; ((ulong)local_158.t >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
              }
            }
            BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&local_158,(BVIndex)lVar27);
            if (0 < iVar28) {
              Output::Print(L",");
            }
            Output::Print(L"s%d",(ulong)((BVIndex)lVar27 + TVar1));
            iVar28 = iVar28 + 1;
          }
        }
        Output::Print(L"}");
      }
      if (((this_03->super_SymOpnd).super_Opnd.field_0xb & 0x10) != 0) {
        Output::Print(L",t");
      }
      pcVar7 = L">";
      goto LAB_005ab0c1;
    }
    pSVar17 = Sym::AsStackSym(this_01->m_sym);
    bVar3 = StackSym::IsArgSlotSym(pSVar17);
    uVar29 = pSVar17->m_offset;
    if (bVar3) {
      if (uVar29 == 0xffffffff) {
        if ((pSVar17->field_0x19 & 0x40) != 0) break;
        uVar29 = 0xffffffff;
      }
    }
    else if (uVar29 == 0) break;
    uVar23 = uVar29;
    if ((this_01->m_offset != 0) && (uVar23 = this_01->m_offset + uVar29, (int)uVar23 < (int)uVar29)
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar18 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                         ,0xc60,"(static_cast<int>(offset + symOpnd->m_offset) >= offset)",
                         "static_cast<int>(offset + symOpnd->m_offset) >= offset");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar18 = 0;
      uVar23 = uVar29 + this_01->m_offset;
    }
    pcVar24 = L"<%d>";
LAB_005aac57:
    Output::Print(pcVar24,(ulong)uVar23);
    break;
  case OpndKindReg:
    pRVar14 = AsRegOpnd(this);
    if (pRVar14->m_sym != (StackSym *)0x0) {
      Sym::Dump(&pRVar14->m_sym->super_Sym,flags,(ValueType)0x9);
    }
    uVar15 = (ulong)pRVar14->m_reg;
    if ((flags & IRDumpFlags_AsmDumpMode) != IRDumpFlags_None) {
      Output::Print(L"%S",RegNames[uVar15]);
      goto LAB_005ab0de;
    }
    if (uVar15 != 0) {
      Output::Print(L"(%S)",RegNames[uVar15]);
    }
    if ((pRVar14->field_0x18 & 1) != 0) {
      Output::Print(L"[isTempLastUse]");
    }
    bVar3 = RegOpnd::IsArrayRegOpnd(pRVar14);
    if (bVar3) {
      if ((flags & IRDumpFlags_SimpleForm) == IRDumpFlags_None) {
        DumpValueType(this);
      }
      this_04 = RegOpnd::AsArrayRegOpnd(pRVar14);
      if (this_04->headSegmentSym != (StackSym *)0x0) {
        Output::Print(L"[seg: ");
        Sym::Dump(&this_04->headSegmentSym->super_Sym,(ValueType)0x9);
        Output::Print(L"]");
      }
      if (this_04->headSegmentLengthSym != (StackSym *)0x0) {
        Output::Print(L"[segLen: ");
        Sym::Dump(&this_04->headSegmentLengthSym->super_Sym,(ValueType)0x9);
        Output::Print(L"]");
      }
      pSVar17 = ArrayRegOpnd::LengthSym(this_04);
      if ((pSVar17 != (StackSym *)0x0) &&
         (pSVar17 = ArrayRegOpnd::LengthSym(this_04), pSVar17 != this_04->headSegmentLengthSym)) {
        Output::Print(L"[len: ");
        pSVar17 = ArrayRegOpnd::LengthSym(this_04);
        Sym::Dump(&pSVar17->super_Sym,(ValueType)0x9);
        Output::Print(L"]");
      }
      if ((this_04->eliminatedLowerBoundCheck != false) ||
         (this_04->eliminatedUpperBoundCheck == true)) {
        Output::Print(L"[");
        if (this_04->eliminatedLowerBoundCheck == true) {
          Output::Print(L">");
        }
        if (this_04->eliminatedUpperBoundCheck == true) {
          Output::Print(L"<");
        }
        Output::Print(L"]");
      }
      goto LAB_005ab0de;
    }
    break;
  case OpndKindAddr:
    DumpOpndKindAddr(this,(bool)((byte)flags & 1),func);
    break;
  case OpndKindIndir:
    this_02 = AsIndirOpnd(this);
    pRVar14 = this_02->m_baseOpnd;
    this_00 = this_02->m_indexOpnd;
    uVar23 = this_02->m_offset;
    Output::Print(L"[");
    if (pRVar14 == (RegOpnd *)0x0) {
      Output::Print(L"<null>");
    }
    else {
      Dump(&pRVar14->super_Opnd,flags,func);
    }
    if (this_00 != (RegOpnd *)0x0) {
      Output::Print(L"+");
      Dump(&this_00->super_Opnd,flags,func);
      if (this_02->m_scale != 0) {
        Output::Print(L"*%d",(ulong)(uint)(1 << (this_02->m_scale & 0x1f)));
      }
    }
    if (uVar23 != 0) {
      if ((DAT_014361b8 == '\0') && (this_02->m_addrKind != ~AddrOpndKindConstantAddress)) {
        Output::Print(L"+XX");
      }
      else {
        pcVar24 = L"";
        if (-1 < (int)uVar23) {
          pcVar24 = L"+";
        }
        if ((flags & IRDumpFlags_AsmDumpMode) == IRDumpFlags_None) {
          pcVar25 = L"%s%d";
        }
        else {
          uVar23 = uVar23 & 0xffff;
          pcVar25 = L"%sXXXX%04d";
        }
        Output::Print(pcVar25,pcVar24,(ulong)uVar23);
      }
    }
    if (this_02->m_desc != (char16 *)0x0) {
      Output::Print(L" <%s>");
    }
    if (this_02->m_addrKind != ~AddrOpndKindConstantAddress) {
      pvVar19 = IndirOpnd::GetOriginalAddress(this_02);
      Output::Print(L" <");
      addressKind = IndirOpnd::GetAddrKind(this_02);
      GetAddrDescription((char16 *)&local_158,0x80,pvVar19,addressKind,false,true,func,true);
      Output::Print(L"%s",&local_158);
      Output::Print(L">");
    }
    pcVar7 = L"]";
    goto LAB_005ab0c1;
  case OpndKindLabel:
    pLVar16 = AsLabelOpnd(this);
    if (pLVar16->m_label != (LabelInstr *)0x0) {
      uVar23 = pLVar16->m_label->m_id;
      pcVar24 = L"&$L%d";
      goto LAB_005aac57;
    }
    pcVar7 = L"??";
    goto LAB_005ab0c1;
  case OpndKindMemRef:
    DumpOpndKindMemRef(this,false,func);
    break;
  case OpndKindRegBV:
    pRVar10 = AsRegBVOpnd(this);
    BVUnitT<unsigned_long>::Dump(&pRVar10->m_value,0,false);
    break;
  case OpndKindList:
    pLVar8 = AsListOpnd(this);
    Output::Print(L"{");
    iVar28 = pLVar8->count;
    iVar4 = iVar28;
    for (lVar27 = 0; lVar27 < iVar4; lVar27 = lVar27 + 1) {
      Dump(&pLVar8->opnds[lVar27]->super_Opnd,flags,func);
      if ((int)lVar27 + 1 < iVar28) {
        Output::Print(L",");
      }
      iVar4 = pLVar8->count;
    }
    pcVar7 = L"}";
LAB_005ab0c1:
    Output::Print(pcVar7);
  }
  if ((flags & (IRDumpFlags_SimpleForm|IRDumpFlags_AsmDumpMode)) == IRDumpFlags_None) {
    DumpValueType(this);
  }
LAB_005ab0de:
  if (((flags & IRDumpFlags_SimpleForm) == IRDumpFlags_None) || (this->m_type != TyVar)) {
    Output::Print(L".");
    IRType_Dump(this->m_type);
  }
  if (((flags & IRDumpFlags_SimpleForm) == IRDumpFlags_None) && ((this->field_0xb & 4) != 0)) {
    Output::Print(L"!");
  }
  return;
}

Assistant:

void
Opnd::Dump(IRDumpFlags flags, Func *func)
{
    bool const AsmDumpMode = flags & IRDumpFlags_AsmDumpMode;
    bool const SimpleForm = !!(flags & IRDumpFlags_SimpleForm);
    FloatConstType floatValue;
    SymOpnd * symOpnd;
    RegOpnd * regOpnd;
    JnHelperMethod helperMethod;
    bool dumpValueType = !SimpleForm;

    switch(GetKind())
    {
    case OpndKindSym:
        symOpnd = this->AsSymOpnd();
        if(symOpnd->m_sym->IsPropertySym() && !SimpleForm)
        {
            symOpnd->m_sym->Dump(flags, symOpnd->GetPropertyOwnerValueType());
        }
        else
        {
            symOpnd->m_sym->Dump(flags);
        }

        if (symOpnd->m_sym->IsStackSym())
        {
            StackSym * stackSym = symOpnd->m_sym->AsStackSym();
            bool hasOffset = stackSym->IsArgSlotSym()?
                ((stackSym->m_offset != -1) || !stackSym->m_isInlinedArgSlot) :
                (stackSym->m_offset != 0);
            if (hasOffset)
            {
                int offset = stackSym->m_offset;
                if(symOpnd->m_offset != 0)
                {
                    Assert(static_cast<int>(offset + symOpnd->m_offset) >= offset);
                    offset += symOpnd->m_offset;
                }
                Output::Print(_u("<%d>"), offset);
            }
        }
        else if (symOpnd->IsPropertySymOpnd() && !SimpleForm)
        {
            PropertySymOpnd *propertySymOpnd = symOpnd->AsPropertySymOpnd();
            Output::Print(_u("<"));
            if (propertySymOpnd->HasObjTypeSpecFldInfo())
            {
                Output::Print(_u("%u,%s%s%s%s,"), propertySymOpnd->GetObjTypeSpecFldId(), propertySymOpnd->IsPoly() ? _u("p") : _u("m"),
                    propertySymOpnd->IsLoadedFromProto() ? _u("~") : _u(""), propertySymOpnd->UsesFixedValue() ? _u("=") : _u(""),
                    propertySymOpnd->IsBeingAdded() ? _u("+") : _u(""));
            }
            else
            {
                Output::Print(_u("?,,"));
            }
            Output::Print(_u("%s%s,"), propertySymOpnd->MayNeedTypeCheckProtection() ?
                propertySymOpnd->IsMono() ? _u("+") : _u("=") :
                propertySymOpnd->IsRootObjectNonConfigurableFieldLoad() ? _u("~") : _u("-"),
                propertySymOpnd->IsTypeCheckSeqCandidate() ? _u("+") : _u("-"));
            if (propertySymOpnd->HasObjectTypeSym())
            {
                Output::Print(_u("s%d"), propertySymOpnd->GetObjectTypeSym()->m_id);
                if (propertySymOpnd->IsTypeChecked())
                {
                    Output::Print(_u("+%s"), propertySymOpnd->IsMono() ? _u("m") : _u("p"));
                }
                else if (propertySymOpnd->IsTypeAvailable())
                {
                    Output::Print(_u("*"));
                }
                if (propertySymOpnd->IsTypeDead())
                {
                    Output::Print(_u("!"));
                }
            }
            else
            {
                Output::Print(_u("s?"));
            }
            if (propertySymOpnd->m_sym->AsPropertySym()->m_writeGuardSym != nullptr)
            {
                Output::Print(_u(",s%d"), propertySymOpnd->m_sym->AsPropertySym()->m_writeGuardSym->m_id);
                if (propertySymOpnd->IsWriteGuardChecked())
                {
                    Output::Print(_u("+"));
                }
            }
            else
            {
                Output::Print(_u(",s?"));
            }
            if (propertySymOpnd->HasFinalType())
            {
                Output::Print(_u(",final:"));
                this->DumpAddress((void*)propertySymOpnd->GetFinalType()->GetAddr(), /* printToConsole */ true, /* skipMaskedAddress */ false);
            }
            if (propertySymOpnd->GetGuardedPropOps() != nullptr)
            {
                Output::Print(_u(",{"));
                if (func != nullptr)
                {
                    int i = 0;
                    auto guardedPropOps = propertySymOpnd->GetGuardedPropOps();
                    FOREACH_BITSET_IN_SPARSEBV(propertyOpId, guardedPropOps)
                    {
                        if (i++ > 0)
                        {
                            Output::Print(_u(","));
                        }
                        const ObjTypeSpecFldInfo* propertyOpInfo = func->GetTopFunc()->GetGlobalObjTypeSpecFldInfo(propertyOpId);
                        if (!JITManager::GetJITManager()->IsOOPJITEnabled())
                        {
                            Output::Print(_u("%s"), func->GetInProcThreadContext()->GetPropertyRecord(propertyOpInfo->GetPropertyId())->GetBuffer(), propertyOpId);
                        }
                        Output::Print(_u("(%u)"), propertyOpId);

                        if (propertyOpInfo->IsLoadedFromProto())
                        {
                            Output::Print(_u("~"));
                        }
                        if (propertyOpInfo->HasFixedValue())
                        {
                            Output::Print(_u("="));
                        }
                        if (propertyOpInfo->IsBeingAdded())
                        {
                            Output::Print(_u("+"));
                        }
                    }
                    NEXT_BITSET_IN_SPARSEBV;
                }
                else
                {
                    Output::Print(_u("(no func)"));
                }
                Output::Print(_u("}"));
            }
            if (propertySymOpnd->GetWriteGuards() != nullptr)
            {
                Output::Print(_u(",{"));
                int i = 0;
                auto writeGuards = propertySymOpnd->GetWriteGuards();
                FOREACH_BITSET_IN_SPARSEBV(writeGuardSymId, writeGuards)
                {
                    if (i++ > 0)
                    {
                        Output::Print(_u(","));
                    }
                    Output::Print(_u("s%d"), writeGuardSymId);
                }
                NEXT_BITSET_IN_SPARSEBV;
                Output::Print(_u("}"));
            }
            if (propertySymOpnd->canStoreTemp)
            {
                Output::Print(_u(",t"));
            }
            Output::Print(_u(">"));
        }

        break;

    case OpndKindReg:
        regOpnd = this->AsRegOpnd();
        if (regOpnd->m_sym)
        {
            regOpnd->m_sym->Dump(flags);
        }
        if(AsmDumpMode)
        {
            //
            // Print no brackets
            //
            Output::Print(_u("%S"), RegNames[regOpnd->GetReg()]);
        }
        else
        {
            if (regOpnd->GetReg() != RegNOREG)
            {
                Output::Print(_u("(%S)"), RegNames[regOpnd->GetReg()]);
            }
            if (regOpnd->m_isTempLastUse)
            {
                Output::Print(_u("[isTempLastUse]"));
            }

            if(regOpnd->IsArrayRegOpnd())
            {
                if(dumpValueType)
                {
                    // Dump the array value type before the associated syms
                    DumpValueType();
                    dumpValueType = false;
                }

                const ArrayRegOpnd *const arrayRegOpnd = regOpnd->AsArrayRegOpnd();
                if(arrayRegOpnd->HeadSegmentSym())
                {
                    Output::Print(_u("[seg: "));
                    arrayRegOpnd->HeadSegmentSym()->Dump();
                    Output::Print(_u("]"));
                }
                if(arrayRegOpnd->HeadSegmentLengthSym())
                {
                    Output::Print(_u("[segLen: "));
                    arrayRegOpnd->HeadSegmentLengthSym()->Dump();
                    Output::Print(_u("]"));
                }
                if(arrayRegOpnd->LengthSym() && arrayRegOpnd->LengthSym() != arrayRegOpnd->HeadSegmentLengthSym())
                {
                    Output::Print(_u("[len: "));
                    arrayRegOpnd->LengthSym()->Dump();
                    Output::Print(_u("]"));
                }
                if(arrayRegOpnd->EliminatedLowerBoundCheck() || arrayRegOpnd->EliminatedUpperBoundCheck())
                {
                    Output::Print(_u("["));
                    if(arrayRegOpnd->EliminatedLowerBoundCheck())
                    {
                        Output::Print(_u(">"));
                    }
                    if(arrayRegOpnd->EliminatedUpperBoundCheck())
                    {
                        Output::Print(_u("<"));
                    }
                    Output::Print(_u("]"));
                }
            }
        }
        break;

    case OpndKindInt64Const:
    {
        Int64ConstOpnd * intConstOpnd = this->AsInt64ConstOpnd();
        intConstOpnd->DumpEncodable();
        break;
    }
    case OpndKindIntConst:
    {
        IntConstOpnd * intConstOpnd = this->AsIntConstOpnd();
        intConstOpnd->DumpEncodable();
        break;
    }

    case OpndKindRegBV:
    {
        RegBVOpnd * regBVOpnd = this->AsRegBVOpnd();
        regBVOpnd->m_value.Dump();
        break;
    }

    case OpndKindHelperCall:
        helperMethod = this->AsHelperCallOpnd()->m_fnHelper;
        Output::Print(_u("%s"), IR::GetMethodName(helperMethod));
        break;

    case OpndKindFloatConst:
        floatValue = this->AsFloatConstOpnd()->m_value;
        Output::Print(_u("%G"), floatValue);
        break;

    case OpndKindFloat32Const:
        Output::Print(_u("%G"), this->AsFloat32ConstOpnd()->m_value);
        break;

    case OpndKindAddr:
        DumpOpndKindAddr(AsmDumpMode, func);
        break;

    case OpndKindIndir:
    {
        IndirOpnd * indirOpnd = this->AsIndirOpnd();
        RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();
        RegOpnd * indexOpnd = indirOpnd->GetIndexOpnd();
        const int32 offset = indirOpnd->GetOffset();

        Output::Print(_u("["));
        if (baseOpnd != nullptr)
        {
            baseOpnd->Dump(flags, func);
        }
        else
        {
            Output::Print(_u("<null>"));
        }

        if (indexOpnd != nullptr)
        {
            Output::Print(_u("+"));
            indexOpnd->Dump(flags, func);
            if (indirOpnd->GetScale() > 0)
            {
                Output::Print(_u("*%d"), 1 << indirOpnd->GetScale());
            }
        }
        if (offset != 0)
        {
            if (!Js::Configuration::Global.flags.DumpIRAddresses && indirOpnd->HasAddrKind())
            {
                Output::Print(_u("+XX"));
            }
            else
            {
                const auto sign = offset >= 0 ? _u("+") : _u("");
                if (AsmDumpMode)
                {
                    Output::Print(_u("%sXXXX%04d"), sign, offset & 0xffff);
                }
                else
                {
                    Output::Print(_u("%s%d"), sign, offset);
                }
            }
        }
        if (indirOpnd->GetDescription())
        {
            Output::Print(_u(" <%s>"), indirOpnd->GetDescription());
        }
        if (indirOpnd->HasAddrKind())
        {
            INT_PTR address = (INT_PTR)indirOpnd->GetOriginalAddress();
            Output::Print(_u(" <"));
            const size_t BUFFER_LEN = 128;
            char16 buffer[BUFFER_LEN];
            GetAddrDescription(buffer, BUFFER_LEN, (void *)address, indirOpnd->GetAddrKind(), AsmDumpMode, /*printToConsole */ true, func, /* skipMaskedAddress */true);
            Output::Print(_u("%s"), buffer);
            Output::Print(_u(">"));
        }

        Output::Print(_u("]"));
        break;
    }
    case IR::OpndKindList:
    {
        IR::ListOpnd* list = this->AsListOpnd();
        Output::Print(_u("{"));
        int count = list->Count();
        list->Map([flags, func, count](int i, IR::Opnd* opnd)
        {
            opnd->Dump(flags, func);
            if (i + 1 < count)
            {
                Output::Print(_u(","));
            }
        });
        Output::Print(_u("}"));
        break;
    }
    case OpndKindMemRef:
    {
        DumpOpndKindMemRef(AsmDumpMode, func);
        break;
    }
    case OpndKindLabel:
    {
        LabelOpnd * labelOpnd = this->AsLabelOpnd();
        LabelInstr * labelInstr = labelOpnd->GetLabel();
        if (labelInstr == nullptr)
        {
            Output::Print(_u("??"));
        }
        else
        {
            Output::Print(_u("&$L%d"), labelInstr->m_id);
        }
        break;
    }
    }

    if(!AsmDumpMode && dumpValueType)
    {
        DumpValueType();
    }
    if (!SimpleForm || this->GetType() != TyVar)
    {
        Output::Print(_u("."));
        IRType_Dump(this->GetType());
    }
    if (this->m_isDead && !SimpleForm)
    {
        Output::Print(_u("!"));
    }
}